

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::GRULayerParams::SharedCtor(GRULayerParams *this)

{
  GRULayerParams *this_local;
  
  memset(&this->updategateweightmatrix_,0,0x5b);
  this->_cached_size_ = 0;
  return;
}

Assistant:

void GRULayerParams::SharedCtor() {
  ::memset(&updategateweightmatrix_, 0, reinterpret_cast<char*>(&reverseinput_) -
    reinterpret_cast<char*>(&updategateweightmatrix_) + sizeof(reverseinput_));
  _cached_size_ = 0;
}